

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_traits_name_macro_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_47d76da::ns::book2a::book2a
          (book2a *this,string *author,string *title,double price)

{
  std::__cxx11::string::string((string *)this,(string *)author);
  std::__cxx11::string::string((string *)(this + 0x20),(string *)title);
  *(double *)(this + 0x40) = price;
  return;
}

Assistant:

book2a(const std::string& author,
              const std::string& title,
              double price)
            : author_(author), title_(title), price_(price)
        {
        }